

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_http_variables.c
# Opt level: O0

ngx_int_t ngx_http_variable_remote_port
                    (ngx_http_request_t *r,ngx_http_variable_value_t *v,uintptr_t data)

{
  in_port_t iVar1;
  u_char *puVar2;
  ulong uVar3;
  ngx_uint_t port;
  uintptr_t data_local;
  ngx_http_variable_value_t *v_local;
  ngx_http_request_t *r_local;
  
  *(uint *)v = *(uint *)v & 0xf0000000;
  *(uint *)v = *(uint *)v & 0xefffffff | 0x10000000;
  *(uint *)v = *(uint *)v & 0xdfffffff;
  *(uint *)v = *(uint *)v & 0xbfffffff;
  puVar2 = (u_char *)ngx_pnalloc(r->pool,5);
  v->data = puVar2;
  if (v->data == (u_char *)0x0) {
    r_local = (ngx_http_request_t *)0xffffffffffffffff;
  }
  else {
    iVar1 = ngx_inet_get_port(r->connection->sockaddr);
    uVar3 = (ulong)iVar1;
    if ((uVar3 != 0) && (uVar3 < 0x10000)) {
      puVar2 = ngx_sprintf(v->data,"%ui",uVar3);
      *(uint *)v = *(uint *)v & 0xf0000000 | (int)puVar2 - (int)v->data & 0xfffffffU;
    }
    r_local = (ngx_http_request_t *)0x0;
  }
  return (ngx_int_t)r_local;
}

Assistant:

static ngx_int_t
ngx_http_variable_remote_port(ngx_http_request_t *r,
    ngx_http_variable_value_t *v, uintptr_t data)
{
    ngx_uint_t  port;

    v->len = 0;
    v->valid = 1;
    v->no_cacheable = 0;
    v->not_found = 0;

    v->data = ngx_pnalloc(r->pool, sizeof("65535") - 1);
    if (v->data == NULL) {
        return NGX_ERROR;
    }

    port = ngx_inet_get_port(r->connection->sockaddr);

    if (port > 0 && port < 65536) {
        v->len = ngx_sprintf(v->data, "%ui", port) - v->data;
    }

    return NGX_OK;
}